

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O2

void enet_peer_reset_queues(ENetPeer *peer)

{
  ENetListIterator position;
  void *__ptr;
  size_t sVar1;
  ENetChannel *__ptr_00;
  ENetChannel *pEVar2;
  
  if ((peer->flags & 1) != 0) {
    enet_list_remove(&peer->dispatchList);
    *(byte *)&peer->flags = (byte)peer->flags & 0xfe;
  }
  while (position = (peer->acknowledgements).sentinel.next,
        position != &(peer->acknowledgements).sentinel) {
    __ptr = enet_list_remove(position);
    enet_free(__ptr);
  }
  enet_peer_reset_outgoing_commands(&peer->sentReliableCommands);
  enet_peer_reset_outgoing_commands(&peer->sentUnreliableCommands);
  enet_peer_reset_outgoing_commands(&peer->outgoingCommands);
  enet_peer_reset_incoming_commands(&peer->dispatchedCommands);
  __ptr_00 = peer->channels;
  if ((__ptr_00 != (ENetChannel *)0x0) &&
     (sVar1 = peer->channelCount, pEVar2 = __ptr_00, sVar1 != 0)) {
    for (; pEVar2 < __ptr_00 + sVar1; pEVar2 = pEVar2 + 1) {
      enet_peer_reset_incoming_commands(&pEVar2->incomingReliableCommands);
      enet_peer_reset_incoming_commands(&pEVar2->incomingUnreliableCommands);
      __ptr_00 = peer->channels;
      sVar1 = peer->channelCount;
    }
    enet_free(__ptr_00);
  }
  peer->channels = (ENetChannel *)0x0;
  peer->channelCount = 0;
  return;
}

Assistant:

void
enet_peer_reset_queues (ENetPeer * peer)
{
    ENetChannel * channel;

    if (peer -> flags & ENET_PEER_FLAG_NEEDS_DISPATCH)
    {
       enet_list_remove (& peer -> dispatchList);

       peer -> flags &= ~ ENET_PEER_FLAG_NEEDS_DISPATCH;
    }

    while (! enet_list_empty (& peer -> acknowledgements))
      enet_free (enet_list_remove (enet_list_begin (& peer -> acknowledgements)));

    enet_peer_reset_outgoing_commands (& peer -> sentReliableCommands);
    enet_peer_reset_outgoing_commands (& peer -> sentUnreliableCommands);
    enet_peer_reset_outgoing_commands (& peer -> outgoingCommands);
    enet_peer_reset_incoming_commands (& peer -> dispatchedCommands);

    if (peer -> channels != NULL && peer -> channelCount > 0)
    {
        for (channel = peer -> channels;
             channel < & peer -> channels [peer -> channelCount];
             ++ channel)
        {
            enet_peer_reset_incoming_commands (& channel -> incomingReliableCommands);
            enet_peer_reset_incoming_commands (& channel -> incomingUnreliableCommands);
        }

        enet_free (peer -> channels);
    }

    peer -> channels = NULL;
    peer -> channelCount = 0;
}